

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

void Fra_ClausEstimateCoverage(Clu_Man_t *p)

{
  void *__s;
  size_t __size;
  uint *puVar1;
  Cnf_Dat_t *pCVar2;
  Aig_Man_t *pAVar3;
  int *piVar4;
  void **ppvVar5;
  int iVar6;
  Fra_Sml_t *pSim;
  int *pVar2Id;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint *pResult;
  long lVar11;
  int iVar12;
  uint uVar13;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Aig_ManRandom(1);
  pSim = Fra_SmlSimulateComb(p->pAig,0x800,0);
  pCVar2 = p->pCnf;
  iVar6 = pCVar2->nVars;
  __size = (long)iVar6 * 4;
  pVar2Id = (int *)malloc(__size);
  memset(pVar2Id,0,__size);
  pAVar3 = p->pAig;
  lVar8 = (long)pAVar3->vObjs->nSize;
  if (0 < lVar8) {
    piVar4 = pCVar2->pVarNums;
    lVar11 = 0;
    do {
      iVar12 = piVar4[lVar11];
      if (-1 < (long)iVar12) {
        if (iVar6 <= iVar12) {
          __assert_fail("p->pCnf->pVarNums[i] < p->pCnf->nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x666,"void Fra_ClausEstimateCoverage(Clu_Man_t *)");
        }
        pVar2Id[iVar12] = (int)lVar11;
      }
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
  }
  if (2 < pAVar3->nObjs[3]) {
    iVar6 = pAVar3->vCos->nSize;
    if (0 < iVar6) {
      local_38 = lVar9;
      if (iVar6 != 1) {
        ppvVar5 = pAVar3->vCos->pArray;
        iVar6 = pSim->nWordsTotal;
        iVar12 = *(int *)((long)*ppvVar5 + 0x24);
        __s = (void *)((long)&pSim[1].pAig +
                      (long)*(int *)((long)ppvVar5[1] + 0x24) * (long)iVar6 * 4);
        iVar10 = 0;
        memset(__s,0,0x2000);
        pVVar7 = p->vClausesProven;
        if (0 < pVVar7->nSize) {
          pResult = (uint *)((long)&pSim[1].pAig + (long)(iVar12 * iVar6) * 4);
          piVar4 = p->vLitsProven->pArray;
          lVar9 = 0;
          iVar6 = 0;
          do {
            iVar12 = pVVar7->pArray[lVar9];
            Fra_ClausEstimateCoverageOne(pSim,piVar4 + iVar6,iVar12 - iVar6,pVar2Id,pResult);
            lVar8 = 0;
            do {
              puVar1 = (uint *)((long)__s + lVar8 * 4);
              *puVar1 = *puVar1 | pResult[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x800);
            lVar9 = lVar9 + 1;
            pVVar7 = p->vClausesProven;
            iVar6 = iVar12;
          } while (lVar9 < pVVar7->nSize);
        }
        lVar9 = 0;
        do {
          uVar13 = *(uint *)((long)__s + lVar9 * 4);
          uVar13 = (uVar13 >> 1 & 0x55555555) + (uVar13 & 0x55555555);
          uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
          uVar13 = (uVar13 >> 4 & 0x7070707) + (uVar13 & 0x7070707);
          uVar13 = (uVar13 >> 8 & 0xf000f) + (uVar13 & 0xf000f);
          iVar10 = iVar10 + (uVar13 >> 0x10) + (uVar13 & 0xffff);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x800);
        Fra_SmlStop(pSim);
        lVar9 = local_38;
        if (pVar2Id != (int *)0x0) {
          free(pVar2Id);
        }
        printf("Care states ratio = %f. ",(double)(int)(0x10000U - iVar10) * 1.52587890625e-05);
        iVar6 = 0x9dafe0;
        printf("(%d out of %d patterns)  ",(ulong)(0x10000U - iVar10),0x10000);
        Abc_Print(iVar6,"%s =","Time");
        iVar12 = 3;
        iVar6 = clock_gettime(3,&local_48);
        if (iVar6 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        Abc_Print(iVar12,"%9.2f sec\n",(double)(lVar8 + lVar9) / 1000000.0);
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Aig_ManCoNum(p->pAig) > 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                ,0x66a,"void Fra_ClausEstimateCoverage(Clu_Man_t *)");
}

Assistant:

void Fra_ClausEstimateCoverage( Clu_Man_t * p )
{
    int nCombSimWords = (1<<11);
    Fra_Sml_t * pComb;
    unsigned * pResultTot, * pResultOne;
    int nCovered, Beg, End, i, w;
    int * pStart, * pVar2Id; 
    abctime clk = Abc_Clock();
    // simulate the circuit with nCombSimWords * 32 = 64K patterns
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, nCombSimWords, 0 );
    // create mapping from SAT vars to node IDs
    pVar2Id = ABC_ALLOC( int, p->pCnf->nVars );
    memset( pVar2Id, 0, sizeof(int) * p->pCnf->nVars );
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        if ( p->pCnf->pVarNums[i] >= 0 )
        {
            assert( p->pCnf->pVarNums[i] < p->pCnf->nVars );
            pVar2Id[ p->pCnf->pVarNums[i] ] = i;
        }
    // get storage for one assignment and all assignments
    assert( Aig_ManCoNum(p->pAig) > 2 );
    pResultOne = Fra_ObjSim( pComb, Aig_ManCo(p->pAig, 0)->Id );
    pResultTot = Fra_ObjSim( pComb, Aig_ManCo(p->pAig, 1)->Id );
    // start the OR of don't-cares
    for ( w = 0; w < nCombSimWords; w++ )
        pResultTot[w] = 0;
    // check clauses
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        Fra_ClausEstimateCoverageOne( pComb, pStart + Beg, End-Beg, pVar2Id, pResultOne );
        Beg = End;
        for ( w = 0; w < nCombSimWords; w++ )
            pResultTot[w] |= pResultOne[w];
    }
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nCombSimWords; w++ )
        nCovered += Aig_WordCountOnes( pResultTot[w] );
    Fra_SmlStop( pComb );
    ABC_FREE( pVar2Id );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nCombSimWords * 32 - nCovered) / (nCombSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nCombSimWords * 32 - nCovered, nCombSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}